

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O0

void __thiscall CNetTokenCache::Update(CNetTokenCache *this)

{
  undefined8 uVar1;
  bool bVar2;
  int64 iVar3;
  CAddressInfo *pCVar4;
  int64 iVar5;
  long in_RDI;
  CConnlessPacketInfo *pNewList;
  CConnlessPacketInfo *pEntry;
  CAddressInfo *pAddrInfo;
  int64 Now;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  CNetTokenCache *this_00;
  long local_20;
  
  iVar3 = time_get();
  while( true ) {
    pCVar4 = TStaticRingBuffer<CNetTokenCache::CAddressInfo,_2560,_1>::First
                       ((TStaticRingBuffer<CNetTokenCache::CAddressInfo,_2560,_1> *)0x24a71b);
    bVar2 = false;
    if (pCVar4 != (CAddressInfo *)0x0) {
      bVar2 = pCVar4->m_Expiry <= iVar3;
    }
    if (!bVar2) break;
    TStaticRingBuffer<CNetTokenCache::CAddressInfo,_2560,_1>::PopFirst
              ((TStaticRingBuffer<CNetTokenCache::CAddressInfo,_2560,_1> *)0x24a758);
  }
  for (local_20 = *(long *)(in_RDI + 0xa28); local_20 != 0; local_20 = *(long *)(local_20 + 0x5b8))
  {
    this_00 = *(CNetTokenCache **)(local_20 + 0x598);
    iVar5 = time_freq();
    if ((long)((this_00->m_TokenCache).m_aBuffer + iVar5 * 2 + -0x28) <= iVar3) {
      FetchToken(this_00,(NETADDR *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      *(int64 *)(local_20 + 0x598) = iVar3;
    }
  }
  while( true ) {
    bVar2 = false;
    if (*(long *)(in_RDI + 0xa28) != 0) {
      bVar2 = *(long *)(*(long *)(in_RDI + 0xa28) + 0x590) <= iVar3;
    }
    if (!bVar2) break;
    uVar1 = *(undefined8 *)(*(long *)(in_RDI + 0xa28) + 0x5b8);
    if (*(void **)(in_RDI + 0xa28) != (void *)0x0) {
      operator_delete(*(void **)(in_RDI + 0xa28),0x5c0);
    }
    *(undefined8 *)(in_RDI + 0xa28) = uVar1;
  }
  return;
}

Assistant:

void CNetTokenCache::Update()
{
	int64 Now = time_get();

	// drop expired address info
	CAddressInfo *pAddrInfo;
	while((pAddrInfo = m_TokenCache.First()) && (pAddrInfo->m_Expiry <= Now))
		m_TokenCache.PopFirst();

	// try to fetch the token again for stored packets
	CConnlessPacketInfo * pEntry = m_pConnlessPacketList;
	while(pEntry)
	{
		if(pEntry->m_LastTokenRequest + 2*time_freq() <= Now)
		{
			FetchToken(&pEntry->m_Addr);
			pEntry->m_LastTokenRequest = Now;
		}
		pEntry = pEntry->m_pNext;
	}

	// drop expired packets
	while(m_pConnlessPacketList && m_pConnlessPacketList->m_Expiry <= Now)
	{
		CConnlessPacketInfo *pNewList = m_pConnlessPacketList->m_pNext;
		delete m_pConnlessPacketList;
		m_pConnlessPacketList = pNewList;
	}
}